

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xio.c
# Opt level: O3

void xio_DestroyOption(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "invalid argument detected: const char* name=%p, const void* value=%p";
    iVar1 = 0xf0;
  }
  else {
    iVar1 = strcmp(name,"concreteOptions");
    if (iVar1 == 0) {
      OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
      return;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "unknown option: %s";
    iVar1 = 0xfa;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/xio.c"
            ,"xio_DestroyOption",iVar1,1,pcVar3,name);
  return;
}

Assistant:

static void xio_DestroyOption(const char* name, const void* value)
{
    if (
        (name == NULL) ||
        (value == NULL)
        )
    {
        LogError("invalid argument detected: const char* name=%p, const void* value=%p", name, value);
    }
    else
    {
        if (strcmp(name, CONCRETE_OPTIONS) == 0)
        {
            OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
        }
        else
        {
            LogError("unknown option: %s", name);
        }
    }
}